

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeviceContextVkImpl.cpp
# Opt level: O2

void __thiscall
Diligent::DeviceContextVkImpl::SetStencilRef(DeviceContextVkImpl *this,Uint32 StencilRef)

{
  bool bVar1;
  
  bVar1 = DeviceContextBase<Diligent::EngineVkImplTraits>::SetStencilRef
                    ((DeviceContextBase<Diligent::EngineVkImplTraits> *)this,StencilRef,0);
  if (bVar1) {
    EnsureVkCmdBuffer(this);
    VulkanUtilities::VulkanCommandBuffer::SetStencilReference
              (&this->m_CommandBuffer,
               (this->super_DeviceContextNextGenBase<Diligent::EngineVkImplTraits>).
               super_DeviceContextBase<Diligent::EngineVkImplTraits>.m_StencilRef);
    return;
  }
  return;
}

Assistant:

void DeviceContextVkImpl::SetStencilRef(Uint32 StencilRef)
{
    if (TDeviceContextBase::SetStencilRef(StencilRef, 0))
    {
        EnsureVkCmdBuffer();
        m_CommandBuffer.SetStencilReference(m_StencilRef);
    }
}